

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_generic_fwrite(mcpl_generic_wfilehandle_t *fh,char *src,uint64_t nbytes)

{
  size_t sVar1;
  
  for (; 0x1fffffff < nbytes; nbytes = nbytes - 0x1fffffff) {
    mcpl_generic_fwrite(fh,src,0x1fffffff);
    src = src + 0x1fffffff;
  }
  if (nbytes != 0) {
    sVar1 = fwrite(src,1,nbytes,(FILE *)fh->internal);
    fh->current_pos = fh->current_pos + sVar1;
    if (sVar1 != nbytes) {
      mcpl_error("Error while writing to file");
    }
  }
  return;
}

Assistant:

void mcpl_generic_fwrite( mcpl_generic_wfilehandle_t* fh,
                          const char * src, uint64_t nbytes )
{
  MCPL_STATIC_ASSERT( sizeof(size_t) >= sizeof(uint32_t) );
  MCPL_STATIC_ASSERT( sizeof(int) >= sizeof(int32_t) );

  //Write nbytes. For safety, we do this in chunks well inside 32bit limit.
  const uint64_t chunk_max = INT32_MAX / 4;
  while ( nbytes > chunk_max ) {
    mcpl_generic_fwrite( fh, src, chunk_max );
    nbytes -= chunk_max;
    src += chunk_max;
  }

  if ( !nbytes )
    return;

  size_t to_write = (size_t)nbytes;
  size_t written = fwrite( src, 1, to_write, (FILE*)(fh->internal) );
  fh->current_pos += written;
  if ( written != to_write )
    mcpl_error("Error while writing to file");
}